

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::PrependSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  iterator iVar1;
  mapped_type *ppcVar2;
  mapped_type this_00;
  allocator local_71;
  key_type local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_50);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
          ::find(&(this->AllSections)._M_t,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->AllSections)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (mapped_type)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_50,name,&local_71);
    cmsys::SystemTools::UpperCase(&local_70,&local_50);
    cmDocumentationSection::cmDocumentationSection(this_00,name,local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    SetSection(this,name,this_00);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_50);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
              ::operator[](&this->AllSections,&local_70);
    this_00 = *ppcVar2;
    std::__cxx11::string::~string((string *)&local_70);
  }
  cmDocumentationSection::Prepend(this_00,docs);
  return;
}

Assistant:

void cmDocumentation::PrependSection(const char* name,
                                     std::vector<cmDocumentationEntry>& docs)
{
  cmDocumentationSection* sec = CM_NULLPTR;
  if (this->AllSections.find(name) == this->AllSections.end()) {
    sec =
      new cmDocumentationSection(name, cmSystemTools::UpperCase(name).c_str());
    this->SetSection(name, sec);
  } else {
    sec = this->AllSections[name];
  }
  sec->Prepend(docs);
}